

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

bool __thiscall
cmInstallScriptGenerator::Compute(cmInstallScriptGenerator *this,cmLocalGenerator *lg)

{
  cmLocalGenerator *this_00;
  PolicyStatus PVar1;
  PolicyID id;
  string local_30;
  
  this->LocalGenerator = lg;
  if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == true) {
    PVar1 = cmLocalGenerator::GetPolicyStatus(lg,CMP0087);
    if (PVar1 - NEW < 3) {
      this->AllowGenex = true;
    }
    else if (PVar1 == WARN) {
      this_00 = this->LocalGenerator;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_30,(cmPolicies *)0x57,id);
      cmLocalGenerator::IssueMessage(this_00,AUTHOR_WARNING,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return true;
}

Assistant:

bool cmInstallScriptGenerator::Compute(cmLocalGenerator* lg)
{
  this->LocalGenerator = lg;

  if (this->ActionsPerConfig) {
    switch (this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0087)) {
      case cmPolicies::WARN:
        this->LocalGenerator->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0087));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        this->AllowGenex = true;
        break;
    }
  }

  return true;
}